

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O3

void __thiscall FileHandlePool::returnResourceToPool(FileHandlePool *this,int index)

{
  atomic<bool> *paVar1;
  pointer *__mutex;
  pointer ppPVar2;
  PoolEntry *pPVar3;
  _func_int *p_Var4;
  iterator __position;
  pointer pcVar5;
  int iVar6;
  fdb_status fVar7;
  ts_nsec start;
  ts_nsec end;
  uint64_t diff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  char *pcVar9;
  bool bVar10;
  fdb_kvs_handle *pfStack_38;
  
  ppPVar2 = (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->pool_vector).
                    super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3) <= (ulong)(long)index) {
    pcVar9 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    this = (FileHandlePool *)pcVar9;
LAB_00107523:
    returnResourceToPool();
    pfStack_38 = (fdb_kvs_handle *)0x0;
    __mutex = &this[1].pool_vector.super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    iVar6 = rand();
    pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)this[1].pool_vector.
                    super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)this[1]._vptr_FileHandlePool >> 3);
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (long)(int)((ulong)(long)iVar6 % (ulong)pbVar8);
    if (__args < pbVar8) {
      p_Var4 = this[1]._vptr_FileHandlePool[(long)__args];
      if (p_Var4 != (_func_int *)0x0) {
        start = get_monotonic_ts();
        fVar7 = fdb_snapshot_open(*(fdb_kvs_handle **)(p_Var4 + 0x10),&pfStack_38,0xffffffffffffffff
                                 );
        end = get_monotonic_ts();
        if (fVar7 != FDB_RESULT_SUCCESS) {
          fdb_assert_die("status == FDB_RESULT_SUCCESS",
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                         ,0x145,(long)fVar7,0);
        }
        diff = ts_diff(start,end);
        collectStat(this,4,diff);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    pcVar9 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",__args,
               pbVar8);
    __position._M_current =
         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar9 + 8);
    if (__position._M_current ==
        *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
         ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar9 + 0x10)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_realloc_insert<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar9,
                 __position,__args);
      return;
    }
    ((__position._M_current)->_M_dataplus)._M_p = (pointer)&(__position._M_current)->field_2;
    pcVar5 = (__args->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__position._M_current,pcVar5,pcVar5 + __args->_M_string_length);
    *(long *)((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar9 + 8) =
         *(long *)((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar9 + 8)
         + 0x20;
    return;
  }
  pPVar3 = ppPVar2[index];
  if (pPVar3 == (PoolEntry *)0x0) {
    returnResourceToPool();
  }
  else {
    paVar1 = &pPVar3->available;
    LOCK();
    bVar10 = (paVar1->_M_base)._M_i == false;
    if (bVar10) {
      (paVar1->_M_base)._M_i = true;
    }
    UNLOCK();
    if (!bVar10) goto LAB_00107523;
  }
  return;
}

Assistant:

void returnResourceToPool(int index) {
        PoolEntry *pe = pool_vector.at(index);
        if (!pe) {
            fprintf(stderr, "Invalid entry!\n");
            return;
        }
        bool inverse = false;
        if (!pe->available.compare_exchange_strong(inverse, true)) {
            fprintf(stderr, "Handles were likely used by another thread!");
            assert(false);
        }
    }